

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExpandedCommandArgument.cxx
# Opt level: O0

void __thiscall
cmExpandedCommandArgument::cmExpandedCommandArgument
          (cmExpandedCommandArgument *this,string *value,bool quoted)

{
  bool quoted_local;
  string *value_local;
  cmExpandedCommandArgument *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)value);
  this->Quoted = quoted;
  return;
}

Assistant:

cmExpandedCommandArgument::cmExpandedCommandArgument(
  std::string const& value, bool quoted):
    Value(value), Quoted(quoted)
{

}